

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeroGenerator.cpp
# Opt level: O1

char HeroGenerator::getCharForHero(Class heroClass)

{
  return (&DAT_0010ec19)[heroClass];
}

Assistant:

char HeroGenerator::getCharForHero(Hero::Class heroClass)
{
    switch(heroClass)
    {
        case Hero::Class::NONE:
            return '.';

        case Hero::Class::PEASANT:
            return 'P';

        case Hero::Class::SWORDSMAN:
            return 'S';
        case Hero::Class::APPRENTICE:
            return 'A';
        case Hero::Class::ARCHER:
            return 'R';

        case Hero::Class::GUNNER:
            return 'G';
        case Hero::Class::KNIGHT:
            return 'K';
        case Hero::Class::MONK:
            return 'M';
        case Hero::Class::INQUISITOR:
            return 'I';
    }
}